

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.h
# Opt level: O2

void __thiscall btBoxShape::setMargin(btBoxShape *this,btScalar collisionMargin)

{
  undefined1 auVar1 [16];
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  btVector3 bVar2;
  btVector3 oldMargin;
  float local_58;
  float fStack_54;
  float local_48;
  btVector3 local_18;
  
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])();
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  local_18.m_floats[3] = 0.0;
  bVar2 = operator+(&(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
                     m_implicitShapeDimensions,&local_18);
  (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.m_collisionMargin =
       collisionMargin;
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  local_58 = bVar2.m_floats[0];
  fStack_54 = bVar2.m_floats[1];
  local_48 = bVar2.m_floats[2];
  auVar1._4_4_ = fStack_54 - extraout_XMM0_Da_00;
  auVar1._0_4_ = local_58 - extraout_XMM0_Da;
  auVar1._8_4_ = local_48 - extraout_XMM0_Da_01;
  auVar1._12_4_ = 0;
  *(undefined1 (*) [16])
   (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.m_implicitShapeDimensions.
   m_floats = auVar1;
  return;
}

Assistant:

virtual void setMargin(btScalar collisionMargin)
	{
		//correct the m_implicitShapeDimensions for the margin
		btVector3 oldMargin(getMargin(),getMargin(),getMargin());
		btVector3 implicitShapeDimensionsWithMargin = m_implicitShapeDimensions+oldMargin;
		
		btConvexInternalShape::setMargin(collisionMargin);
		btVector3 newMargin(getMargin(),getMargin(),getMargin());
		m_implicitShapeDimensions = implicitShapeDimensionsWithMargin - newMargin;

	}